

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QTextOption::Tab>::moveAppend
          (QGenericArrayOps<QTextOption::Tab> *this,Tab *b,Tab *e)

{
  qsizetype *pqVar1;
  Tab *pTVar2;
  Tab *pTVar3;
  TabType TVar4;
  QChar QVar5;
  undefined2 uVar6;
  
  if (b != e) {
    pTVar3 = (this->super_QArrayDataPointer<QTextOption::Tab>).ptr;
    for (; b < e; b = b + 1) {
      TVar4 = b->type;
      QVar5.ucs = (b->delimiter).ucs;
      uVar6 = *(undefined2 *)&b->field_0xe;
      pTVar2 = pTVar3 + (this->super_QArrayDataPointer<QTextOption::Tab>).size;
      pTVar2->position = b->position;
      pTVar2->type = TVar4;
      pTVar2->delimiter = (QChar)QVar5.ucs;
      *(undefined2 *)&pTVar2->field_0xe = uVar6;
      pqVar1 = &(this->super_QArrayDataPointer<QTextOption::Tab>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }